

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbmp.cpp
# Opt level: O0

BMP * BMP_Create(unsigned_long width,unsigned_long height,unsigned_short depth)

{
  int iVar1;
  ulong uVar2;
  void *pvVar3;
  long local_48;
  unsigned_long bytes_per_row;
  int bytes_per_pixel;
  BMP *bmp;
  unsigned_short depth_local;
  unsigned_long height_local;
  unsigned_long width_local;
  
  if ((height == 0) || (width == 0)) {
    BMP_LAST_ERROR_CODE = BMP_INVALID_ARGUMENT;
    width_local = 0;
  }
  else if (((depth == 8) || (depth == 0x18)) || (depth == 0x20)) {
    width_local = (unsigned_long)calloc(1,0x80);
    if ((undefined2 *)width_local == (undefined2 *)0x0) {
      BMP_LAST_ERROR_CODE = BMP_OUT_OF_MEMORY;
      width_local = 0;
    }
    else {
      *(undefined2 *)width_local = 0x4d42;
      *(undefined2 *)(width_local + 0x10) = 0;
      *(undefined2 *)(width_local + 0x12) = 0;
      *(undefined8 *)(width_local + 0x20) = 0x28;
      *(undefined2 *)(width_local + 0x38) = 1;
      *(undefined8 *)(width_local + 0x40) = 0;
      *(undefined8 *)(width_local + 0x50) = 0;
      *(undefined8 *)(width_local + 0x58) = 0;
      *(undefined8 *)(width_local + 0x60) = 0;
      *(undefined8 *)(width_local + 0x68) = 0;
      uVar2 = width * (long)((int)(uint)depth >> 3);
      if ((uVar2 & 3) == 0) {
        local_48 = 0;
      }
      else {
        local_48 = 4 - (uVar2 & 3);
      }
      *(unsigned_long *)(width_local + 0x28) = width;
      *(unsigned_long *)(width_local + 0x30) = height;
      *(unsigned_short *)(width_local + 0x3a) = depth;
      *(ulong *)(width_local + 0x48) = (local_48 + uVar2) * height;
      iVar1 = 0;
      if (depth == 8) {
        iVar1 = 0x400;
      }
      *(long *)(width_local + 8) = *(long *)(width_local + 0x48) + 0x36 + (long)iVar1;
      iVar1 = 0;
      if (depth == 8) {
        iVar1 = 0x400;
      }
      *(long *)(width_local + 0x18) = (long)(iVar1 + 0x36);
      if (*(short *)(width_local + 0x3a) == 8) {
        pvVar3 = calloc(0x400,1);
        *(void **)(width_local + 0x70) = pvVar3;
        if (*(long *)(width_local + 0x70) == 0) {
          BMP_LAST_ERROR_CODE = BMP_OUT_OF_MEMORY;
          free((void *)width_local);
          return (BMP *)0x0;
        }
      }
      else {
        *(undefined8 *)(width_local + 0x70) = 0;
      }
      pvVar3 = calloc(*(size_t *)(width_local + 0x48),1);
      *(void **)(width_local + 0x78) = pvVar3;
      if (*(long *)(width_local + 0x78) == 0) {
        BMP_LAST_ERROR_CODE = BMP_OUT_OF_MEMORY;
        free(*(void **)(width_local + 0x70));
        free((void *)width_local);
        width_local = 0;
      }
      else {
        BMP_LAST_ERROR_CODE = BMP_OK;
      }
    }
  }
  else {
    BMP_LAST_ERROR_CODE = BMP_FILE_NOT_SUPPORTED;
    width_local = 0;
  }
  return (BMP *)width_local;
}

Assistant:

BMP* BMP_Create( UINT width, UINT height, USHORT depth )
{
	BMP*	bmp;
	int		bytes_per_pixel = depth >> 3;
	UINT	bytes_per_row;

	if ( height <= 0 || width <= 0 )
	{
		BMP_LAST_ERROR_CODE = BMP_INVALID_ARGUMENT;
		return NULL;
	}

	if ( depth != 8 && depth != 24 && depth != 32 )
	{
		BMP_LAST_ERROR_CODE = BMP_FILE_NOT_SUPPORTED;
		return NULL;
	}


	/* Allocate the bitmap data structure */
	bmp = (BMP*)calloc( 1, sizeof( BMP ) );
	if ( bmp == NULL )
	{
		BMP_LAST_ERROR_CODE = BMP_OUT_OF_MEMORY;
		return NULL;
	}


	/* Set header' default values */
	bmp->Header.Magic				= 0x4D42;
	bmp->Header.Reserved1			= 0;
	bmp->Header.Reserved2			= 0;
	bmp->Header.HeaderSize			= 40;
	bmp->Header.Planes				= 1;
	bmp->Header.CompressionType		= 0;
	bmp->Header.HPixelsPerMeter		= 0;
	bmp->Header.VPixelsPerMeter		= 0;
	bmp->Header.ColorsUsed			= 0;
	bmp->Header.ColorsRequired		= 0;


	/* Calculate the number of bytes used to store a single image row. This is always
	rounded up to the next multiple of 4. */
	bytes_per_row = width * bytes_per_pixel;
	bytes_per_row += ( bytes_per_row % 4 ? 4 - bytes_per_row % 4 : 0 );


	/* Set header's image specific values */
	bmp->Header.Width				= width;
	bmp->Header.Height				= height;
	bmp->Header.BitsPerPixel		= depth;
	bmp->Header.ImageDataSize		= bytes_per_row * height;
	bmp->Header.FileSize			= bmp->Header.ImageDataSize + 54 + ( depth == 8 ? BMP_PALETTE_SIZE : 0 );
	bmp->Header.DataOffset			= 54 + ( depth == 8 ? BMP_PALETTE_SIZE : 0 );


	/* Allocate palette */
	if ( bmp->Header.BitsPerPixel == 8 )
	{
		bmp->Palette = (UCHAR*) calloc( BMP_PALETTE_SIZE, sizeof( UCHAR ) );
		if ( bmp->Palette == NULL )
		{
			BMP_LAST_ERROR_CODE = BMP_OUT_OF_MEMORY;
			free( bmp );
			return NULL;
		}
	}
	else
	{
		bmp->Palette = NULL;
	}


	/* Allocate pixels */
	bmp->Data = (UCHAR*) calloc( bmp->Header.ImageDataSize, sizeof( UCHAR ) );
	if ( bmp->Data == NULL )
	{
		BMP_LAST_ERROR_CODE = BMP_OUT_OF_MEMORY;
		free( bmp->Palette );
		free( bmp );
		return NULL;
	}


	BMP_LAST_ERROR_CODE = BMP_OK;

	return bmp;
}